

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_pool.cpp
# Opt level: O0

void __thiscall cppcms::session_pool::session_pool(session_pool *this,service *srv)

{
  _data *v;
  _data *in_RSI;
  noncopyable *in_RDI;
  noncopyable *this_00;
  
  this_00 = in_RDI;
  booster::noncopyable::noncopyable(in_RDI);
  v = (_data *)operator_new(0x18);
  *(undefined8 *)v = 0;
  (v->settings).d.d.ptr_ = (_data *)0x0;
  (v->cached_settings).ptr_ = (cached_settings *)0x0;
  _data::_data(in_RSI);
  booster::hold_ptr<cppcms::session_pool::_data>::hold_ptr
            ((hold_ptr<cppcms::session_pool::_data> *)in_RDI,v);
  std::unique_ptr<cppcms::session_api_factory,std::default_delete<cppcms::session_api_factory>>::
  unique_ptr<std::default_delete<cppcms::session_api_factory>,void>
            ((unique_ptr<cppcms::session_api_factory,_std::default_delete<cppcms::session_api_factory>_>
              *)this_00);
  std::
  unique_ptr<cppcms::sessions::encryptor_factory,std::default_delete<cppcms::sessions::encryptor_factory>>
  ::unique_ptr<std::default_delete<cppcms::sessions::encryptor_factory>,void>
            ((unique_ptr<cppcms::sessions::encryptor_factory,_std::default_delete<cppcms::sessions::encryptor_factory>_>
              *)this_00);
  std::
  unique_ptr<cppcms::sessions::session_storage_factory,std::default_delete<cppcms::sessions::session_storage_factory>>
  ::unique_ptr<std::default_delete<cppcms::sessions::session_storage_factory>,void>
            ((unique_ptr<cppcms::sessions::session_storage_factory,_std::default_delete<cppcms::sessions::session_storage_factory>_>
              *)this_00);
  *(_data **)(this_00 + 0x20) = in_RSI;
  return;
}

Assistant:

session_pool::session_pool(service &srv) :
	d(new _data()),
	service_(&srv)
{
}